

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ossadmin_test.cc
# Opt level: O0

int main(void)

{
  test_bind_bucket_vip();
  test_create_img_vpc();
  test_create_oss_vpc();
  test_delete_img_vpc();
  test_delete_oss_vpc();
  test_get_bucket_vips();
  test_get_img_vpc_info();
  test_get_oss_vpc_info();
  test_un_bind_bucket_vip();
  return 0;
}

Assistant:

int main() {
  test_bind_bucket_vip();
  test_create_img_vpc();
  test_create_oss_vpc();
  test_delete_img_vpc();
  test_delete_oss_vpc();
  test_get_bucket_vips();
  test_get_img_vpc_info();
  test_get_oss_vpc_info();
  test_un_bind_bucket_vip();
}